

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> * __thiscall
cmGlobalGenerator::GetLocalGeneratorTargetsInOrder
          (vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__return_storage_ptr__
          ,cmGlobalGenerator *this,cmLocalGenerator *lg)

{
  pointer puVar1;
  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  __first;
  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  __last;
  long lVar2;
  ulong uVar3;
  pointer puVar4;
  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  __i;
  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  __last_00;
  _Head_base<0UL,_cmGeneratorTarget_*,_false> local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar4 = (lg->GeneratorTargets).
           super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (lg->GeneratorTargets).
           super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar4 != puVar1) {
    do {
      local_30._M_head_impl =
           (puVar4->_M_t).
           super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>._M_t.
           super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
           super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
      std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>::
      emplace_back<cmGeneratorTarget*>
                ((vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *)
                 __return_storage_ptr__,&local_30._M_head_impl);
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar1);
    __first._M_current =
         (__return_storage_ptr__->
         super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>)._M_impl.
         super__Vector_impl_data._M_start;
    __last._M_current =
         (__return_storage_ptr__->
         super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__first._M_current != __last._M_current) {
      uVar3 = (long)__last._M_current - (long)__first._M_current >> 3;
      lVar2 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cmGlobalGenerator::GetLocalGeneratorTargetsInOrder(cmLocalGenerator*)const::__0>>
                (__first,__last,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmGlobalGenerator_cxx:1696:13)>
                  )this);
      if ((long)__last._M_current - (long)__first._M_current < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmGlobalGenerator::GetLocalGeneratorTargetsInOrder(cmLocalGenerator*)const::__0>>
                  (__first,__last,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmGlobalGenerator_cxx:1696:13)>
                    )this);
      }
      else {
        __last_00._M_current = __first._M_current + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmGlobalGenerator::GetLocalGeneratorTargetsInOrder(cmLocalGenerator*)const::__0>>
                  (__first,__last_00,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmGlobalGenerator_cxx:1696:13)>
                    )this);
        for (; __last_00._M_current != __last._M_current;
            __last_00._M_current = __last_00._M_current + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,__gnu_cxx::__ops::_Val_comp_iter<cmGlobalGenerator::GetLocalGeneratorTargetsInOrder(cmLocalGenerator*)const::__0>>
                    (__last_00,
                     (_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmGlobalGenerator_cxx:1696:13)>
                      )this);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<cmGeneratorTarget*>
cmGlobalGenerator::GetLocalGeneratorTargetsInOrder(cmLocalGenerator* lg) const
{
  std::vector<cmGeneratorTarget*> gts;
  cm::append(gts, lg->GetGeneratorTargets());
  std::sort(gts.begin(), gts.end(),
            [this](cmGeneratorTarget const* l, cmGeneratorTarget const* r) {
              return this->TargetOrderIndex.at(l) <
                this->TargetOrderIndex.at(r);
            });
  return gts;
}